

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

int CRYPTO_pkcs7_unpad(uint *unpadded_buflen_p,uchar *buf,uint blocksize)

{
  byte bVar1;
  bool local_32;
  uchar pad;
  uint i;
  uchar invalid;
  uchar c;
  uchar mask;
  uchar *tail;
  uint blocksize_local;
  uchar *buf_local;
  uint *unpadded_buflen_p_local;
  uint local_4;
  
  mask = '\0';
  invalid = '\0';
  if ((blocksize == 0) || (0xff < blocksize)) {
    local_4 = 0;
  }
  else {
    bVar1 = buf[blocksize - 1];
    for (i = 0; i < blocksize; i = i + 1) {
      mask = mask | (byte)((i ^ bVar1) - 1 >> 0x18);
      invalid = invalid | ((buf + (blocksize - 1))[-(ulong)i] ^ bVar1) & (mask ^ 0xff);
    }
    *unpadded_buflen_p = blocksize - bVar1;
    local_32 = invalid == '\0' && bVar1 <= blocksize;
    local_4 = (uint)local_32;
  }
  return local_4;
}

Assistant:

int CRYPTO_pkcs7_unpad(unsigned int *unpadded_buflen_p, unsigned char *buf, unsigned int blocksize)
{
    const unsigned char       *tail;
    unsigned char              mask = 0U;
    unsigned char              c;
    unsigned char              invalid = 0U;
    unsigned int               i;
    unsigned char              pad;

    if (blocksize <= 0U || blocksize >= 256U)
        return GML_ERROR;

    tail = &buf[blocksize - 1U];
    pad = *tail;

    for (i = 0U; i < blocksize; i++) {
        c = *(tail - i);
        mask |= (unsigned char) (((i ^ (unsigned int) pad) - 1U) >> ((sizeof(unsigned int) - 1) * 8));
        invalid |= (c ^ pad) & (~mask);
    }
    *unpadded_buflen_p = blocksize - (unsigned int) pad;

    return (int)(invalid == 0U && pad <= blocksize);
}